

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall util::exception::exception<char_const(&)[17]>(exception *this,char (*args) [17])

{
  char (*in_RDX) [17];
  string local_30;
  
  make_string<char_const(&)[17]>(&local_30,(util *)args,in_RDX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_001dcc58;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}